

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O0

float wabt::interp::FloatMax<float>(float lhs,float rhs)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  float *pfVar4;
  float local_1c;
  byte local_15;
  float local_14;
  float local_10;
  float rhs_local;
  float lhs_local;
  
  local_14 = rhs;
  local_10 = lhs;
  uVar2 = std::isnan((double)(ulong)(uint)lhs);
  local_15 = 1;
  if ((uVar2 & 1) == 0) {
    iVar3 = std::isnan((double)(ulong)(uint)local_14);
    local_15 = (byte)iVar3;
  }
  if ((local_15 & 1) == 0) {
    bVar1 = false;
    if ((local_10 == 0.0) && (!NAN(local_10))) {
      bVar1 = local_14 == 0.0;
    }
    if (bVar1) {
      bVar1 = std::signbit(local_10);
      if (bVar1) {
        local_1c = local_14;
      }
      else {
        local_1c = local_10;
      }
      rhs_local = local_1c;
    }
    else {
      pfVar4 = std::max<float>(&local_10,&local_14);
      rhs_local = *pfVar4;
    }
  }
  else {
    rhs_local = std::numeric_limits<float>::quiet_NaN();
  }
  return rhs_local;
}

Assistant:

T WABT_VECTORCALL FloatMax(T lhs, T rhs) {
  if (WABT_UNLIKELY(std::isnan(lhs) || std::isnan(rhs))) {
    return std::numeric_limits<T>::quiet_NaN();
  } else if (WABT_UNLIKELY(lhs == 0 && rhs == 0)) {
    return std::signbit(lhs) ? rhs : lhs;
  } else {
    return std::max(lhs, rhs);
  }
}